

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::CoronaLoader::loadMaterial(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  runtime_error *this_00;
  CoronaLoader *pCVar2;
  size_type sVar3;
  _func_int **pp_Var4;
  long *in_RDX;
  MaterialNode *in_RDI;
  float fVar5;
  Vec3fa VVar6;
  string name;
  Ref<embree::XML> *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *__range2;
  Ref<embree::OBJMaterial> objmaterial;
  vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
  *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  allocator *paVar7;
  string *in_stack_fffffffffffff950;
  OBJMaterial *in_stack_fffffffffffff958;
  key_type *__k;
  string *in_stack_fffffffffffff980;
  XML *in_stack_fffffffffffff988;
  Ref<embree::XML> *in_stack_fffffffffffff990;
  CoronaLoader *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  CoronaLoader *in_stack_fffffffffffff9b0;
  XML *in_stack_fffffffffffff9b8;
  CoronaLoader *in_stack_fffffffffffff9c0;
  ParseLocation *in_stack_fffffffffffff9e8;
  CoronaLoader *in_stack_fffffffffffff9f8;
  XML *in_stack_fffffffffffffa00;
  allocator local_491;
  Ref<embree::XML> *in_stack_fffffffffffffb70;
  CoronaLoader *in_stack_fffffffffffffb78;
  string local_470 [39];
  undefined1 local_449 [33];
  string local_428 [48];
  undefined4 local_3f8;
  undefined1 local_3e1 [33];
  long *local_3c0;
  undefined4 local_3b8 [5];
  allocator local_3a1;
  string local_3a0 [32];
  long *local_380;
  allocator local_371;
  string local_370 [32];
  long *local_350;
  allocator local_341;
  string local_340 [32];
  long *local_320;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  _Base_ptr local_2f8;
  size_t sStack_2f0;
  reference local_2e0;
  Ref<embree::XML> *local_2d8;
  __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
  local_2d0;
  long local_2c8;
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [32];
  CoronaLoader *local_298;
  allocator local_289;
  string local_288 [32];
  string local_268 [35];
  undefined1 local_245;
  string local_1f8 [32];
  long *local_1d8;
  long *local_1c0;
  reference local_1b8;
  const_reference local_1b0;
  reference local_1a8;
  reference local_1a0;
  reference local_198;
  reference local_190;
  reference local_188;
  reference local_180;
  reference local_178;
  reference local_170;
  reference local_168;
  reference local_160;
  const_reference local_158;
  reference local_150;
  reference local_148;
  reference local_140;
  long *local_138;
  long *local_130;
  long *local_128;
  long *local_120;
  CoronaLoader *local_110;
  CoronaLoader **local_108;
  CoronaLoader **local_100;
  CoronaLoader **local_f8;
  CoronaLoader **local_f0;
  CoronaLoader **local_e8;
  CoronaLoader **local_e0;
  CoronaLoader **local_d8;
  CoronaLoader **local_d0;
  CoronaLoader **local_c8;
  undefined4 *local_c0;
  size_type *local_b8;
  undefined4 *local_b0;
  Ref<embree::SceneGraph::Node> *local_a8;
  _Base_ptr *local_a0;
  _Base_ptr *local_98;
  long **local_90;
  long **local_80;
  long **local_70;
  long **local_60;
  CoronaLoader **local_50;
  CoronaLoader **local_40;
  mapped_type *local_30;
  CoronaLoader *local_20;
  _func_int **local_10;
  
  local_1d8 = in_RDX;
  bVar1 = std::operator!=(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
  if (bVar1) {
    local_245 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120 = local_1d8;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffff9e8);
    std::operator+(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
    local_128 = local_1d8;
    std::operator+(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::runtime_error::runtime_error(this_00,local_1f8);
    local_245 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_130 = local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"class",&local_289);
  XML::parm(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  if (bVar1) {
    pCVar2 = (CoronaLoader *)SceneGraph::MaterialNode::operator_new(0x409bcf);
    local_2ba = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"",&local_2b9);
    OBJMaterial::OBJMaterial(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    local_2ba = 0;
    local_108 = &local_298;
    local_110 = pCVar2;
    local_298 = pCVar2;
    if (pCVar2 != (CoronaLoader *)0x0) {
      (**(code **)(*(_func_int **)&(pCVar2->path).filename + 0x10))();
    }
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    local_138 = local_1d8;
    local_2c8 = *local_1d8 + 0x80;
    local_2d0._M_current =
         (Ref<embree::XML> *)
         std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::begin
                   (in_stack_fffffffffffff938);
    local_2d8 = (Ref<embree::XML> *)
                std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                end(in_stack_fffffffffffff938);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                               *)in_stack_fffffffffffff940,
                              (__normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                               *)in_stack_fffffffffffff938), bVar1) {
      local_2e0 = __gnu_cxx::
                  __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
                  ::operator*(&local_2d0);
      local_140 = local_2e0;
      bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
      if (bVar1) {
        load<embree::Vec3fa>
                  (in_stack_fffffffffffff9c0,(Ref<embree::XML> *)in_stack_fffffffffffff9b8);
        local_c8 = &local_298;
        local_98 = &(local_298->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right;
        local_a0 = &local_2f8;
        *local_98 = local_2f8;
        (local_298->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = sStack_2f0;
        local_148 = local_2e0;
        sVar3 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                size(&local_2e0->ptr->children);
        if (sVar3 != 0) {
          local_150 = local_2e0;
          local_158 = std::
                      vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                      operator[](&local_2e0->ptr->children,0);
          bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
          if (bVar1) {
            local_160 = local_2e0;
            std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
            operator[](&local_2e0->ptr->children,0);
            loadMap(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
            local_d0 = &local_298;
            std::shared_ptr<embree::Texture>::operator=
                      ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff940,
                       (shared_ptr<embree::Texture> *)in_stack_fffffffffffff938);
            std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x409f74);
          }
        }
      }
      else {
        local_168 = local_2e0;
        bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
        if (bVar1) {
          local_170 = local_2e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_340,"color",&local_341);
          XML::child(in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
          VVar6 = load<embree::Vec3fa>
                            (in_stack_fffffffffffff9c0,(Ref<embree::XML> *)in_stack_fffffffffffff9b8
                            );
          local_d8 = &local_298;
          local_a8 = &local_298->root;
          local_b0 = &local_318;
          *(undefined4 *)&local_a8->ptr = local_318;
          *(undefined4 *)((long)&(local_298->root).ptr + 4) = uStack_314;
          *(undefined4 *)&local_298[1].path.filename = uStack_310;
          *(undefined4 *)&local_298[1].path.filename.field_0x4 = uStack_30c;
          local_90 = &local_320;
          if (local_320 != (long *)0x0) {
            (**(code **)(*local_320 + 0x18))(local_318,VVar6.field_0._8_8_);
          }
          std::__cxx11::string::~string(local_340);
          std::allocator<char>::~allocator((allocator<char> *)&local_341);
          local_178 = local_2e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_370,"ior",&local_371);
          XML::child(in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
          fVar5 = load<float>(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
          local_e0 = &local_298;
          *(float *)&(local_298->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                     field_0x4 = fVar5;
          local_80 = &local_350;
          if (local_350 != (long *)0x0) {
            (**(code **)(*local_350 + 0x18))();
          }
          std::__cxx11::string::~string(local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          local_180 = local_2e0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3a0,"glossiness",&local_3a1);
          XML::child(in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
          fVar5 = load<float>(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
          local_e8 = &local_298;
          (local_298->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               (_Rb_tree_color)fVar5;
          local_70 = &local_380;
          if (local_380 != (long *)0x0) {
            (**(code **)(*local_380 + 0x18))();
          }
          std::__cxx11::string::~string(local_3a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        }
        else {
          local_188 = local_2e0;
          bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
          if (bVar1) {
            local_190 = local_2e0;
            in_stack_fffffffffffffa00 = (XML *)local_3e1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_3e1 + 1),"color",(allocator *)in_stack_fffffffffffffa00);
            XML::child(in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
            VVar6 = load<embree::Vec3fa>
                              (in_stack_fffffffffffff9c0,
                               (Ref<embree::XML> *)in_stack_fffffffffffff9b8);
            local_f0 = &local_298;
            local_b8 = &local_298[1].path.filename._M_string_length;
            local_c0 = local_3b8;
            *(undefined4 *)local_b8 = local_3b8[0];
            *(undefined4 *)((long)&local_298[1].path.filename._M_string_length + 4) = local_3b8[1];
            *(undefined4 *)&local_298[1].path.filename.field_2 = local_3b8[2];
            *(undefined4 *)((long)&local_298[1].path.filename.field_2 + 4) = local_3b8[3];
            local_60 = &local_3c0;
            in_stack_fffffffffffff9f8 = local_298;
            if (local_3c0 != (long *)0x0) {
              (**(code **)(*local_3c0 + 0x18))(local_3b8[0],VVar6.field_0._8_8_);
            }
            std::__cxx11::string::~string((string *)(local_3e1 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_3e1);
          }
          else {
            local_198 = local_2e0;
            bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
            if (bVar1) {
              load<embree::Vec3fa>
                        (in_stack_fffffffffffff9c0,(Ref<embree::XML> *)in_stack_fffffffffffff9b8);
              local_f8 = &local_298;
              *(undefined4 *)&(local_298->textureFileMap)._M_t._M_impl.field_0x4 = local_3f8;
              local_1a0 = local_2e0;
              in_stack_fffffffffffff9c0 = (CoronaLoader *)local_2e0->ptr;
              sVar3 = std::
                      vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                      size((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            *)&in_stack_fffffffffffff9c0->textureFileMap);
              if (sVar3 != 0) {
                local_1a8 = local_2e0;
                in_stack_fffffffffffff9b8 = local_2e0->ptr;
                local_1b0 = std::
                            vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            ::operator[](&in_stack_fffffffffffff9b8->children,0);
                bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938)
                ;
                if (bVar1) {
                  local_1b8 = local_2e0;
                  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ::operator[](&local_2e0->ptr->children,0);
                  loadMap(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
                  local_100 = &local_298;
                  in_stack_fffffffffffff998 = local_298;
                  std::shared_ptr<embree::Texture>::operator=
                            ((shared_ptr<embree::Texture> *)in_stack_fffffffffffff940,
                             (shared_ptr<embree::Texture> *)in_stack_fffffffffffff938);
                  std::shared_ptr<embree::Texture>::~shared_ptr
                            ((shared_ptr<embree::Texture> *)0x40aaca);
                }
              }
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_embree::Ref<embree::XML>_*,_std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>_>
      ::operator++(&local_2d0);
    }
    local_50 = &local_298;
    local_20 = local_298;
    (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)local_298;
    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
    }
    local_40 = &local_298;
    if (local_298 != (CoronaLoader *)0x0) {
      (**(code **)(*(_func_int **)&(local_298->path).filename + 0x18))();
    }
  }
  else {
    local_1c0 = local_1d8;
    __k = (key_type *)local_449;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_449 + 1),"class",(allocator *)__k);
    XML::parm(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    bVar1 = std::operator==(in_stack_fffffffffffff940,(char *)in_stack_fffffffffffff938);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string((string *)(local_449 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_449);
    if (bVar1) {
      load<std::__cxx11::string>
                (in_stack_fffffffffffff9b0,
                 (Ref<embree::XML> *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
      local_30 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                               *)in_stack_fffffffffffff980,__k);
      (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)local_30->ptr;
      if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      std::__cxx11::string::~string(local_470);
    }
    else {
      pp_Var4 = (_func_int **)SceneGraph::MaterialNode::operator_new(0x40addb);
      paVar7 = &local_491;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffb70,"",paVar7);
      OBJMaterial::OBJMaterial(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var4;
      local_10 = pp_Var4;
      if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb70);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
    }
  }
  return (Ref<embree::SceneGraph::MaterialNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::MaterialNode> CoronaLoader::loadMaterial(const Ref<XML>& xml) 
  {
    if (xml->name != "material") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material: "+xml->name);

    /* native material */
    if (xml->parm("class") == "Native") 
    {
      /* we convert into an OBJ material */
      Ref<OBJMaterial> objmaterial = new OBJMaterial;
      for (auto& child : xml->children)
      {
        if (child->name == "diffuse") {
          objmaterial->Kd = load<Vec3fa>(child);
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_Kd = loadMap(child->children[0]);
        }
        else if (child->name == "reflect") {
          objmaterial->Ks = load<Vec3fa>(child->child("color"));
          objmaterial->Ni = load<float >(child->child("ior"));
          objmaterial->Ns = load<float >(child->child("glossiness"));
        }
        else if (child->name == "translucency") {
          objmaterial->Kt = load<Vec3fa>(child->child("color"));
        }
        else if (child->name == "opacity") {
          objmaterial->d = load<Vec3fa>(child).x;
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_d = loadMap(child->children[0]);
        }
      }
      return objmaterial.dynamicCast<SceneGraph::MaterialNode>();
    }

    /* reference by name */
    else if (xml->parm("class") == "Reference") 
    {
      const std::string name = load<std::string>(xml);
      return materialMap[name];
    }

    /* else return default material */
    else 
      return new OBJMaterial;
  }